

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

Testlist * __thiscall Parser::arrayInit(Parser *this)

{
  Testlist *pTVar1;
  undefined8 extraout_RAX;
  Token closeBrace;
  string local_d0;
  string local_b0;
  Token local_90;
  
  pTVar1 = testList(this);
  Tokenizer::getToken(&local_90,this->tokenizer);
  if (local_90._symbol == ']') {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._string._M_dataplus._M_p != &local_90._string.field_2) {
      operator_delete(local_90._string._M_dataplus._M_p,
                      local_90._string.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._relOp._M_dataplus._M_p != &local_90._relOp.field_2) {
      operator_delete(local_90._relOp._M_dataplus._M_p,
                      local_90._relOp.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._name._M_dataplus._M_p != &local_90._name.field_2) {
      operator_delete(local_90._name._M_dataplus._M_p,
                      local_90._name.field_2._M_allocated_capacity + 1);
    }
    return pTVar1;
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Parser::arrayInit","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"Expected an ] sign, instead got","");
  die(this,&local_b0,&local_d0,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  Token::~Token(&local_90);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Testlist *Parser::arrayInit() {
//    Token openBrace = tokenizer.getToken();
//    if (!openBrace.isOpenBrace())
//        die("Parser::arrayInit", "Expected an [ sign, instead got", openBrace);
    Testlist * arrayTestlist = testList();
    Token closeBrace = tokenizer.getToken();
    if (!closeBrace.isCloseBrace())
        die("Parser::arrayInit", "Expected an ] sign, instead got", closeBrace);
    return arrayTestlist;
}